

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphEdit.cpp
# Opt level: O0

void __thiscall GraphEdit::calculateAxis(GraphEdit *this)

{
  int iVar1;
  QWidget *this_00;
  QWidget local_18 [8];
  QFontMetrics metrics;
  GraphEdit *this_local;
  
  _metrics = this;
  QWidget::fontMetrics(local_18);
  iVar1 = QFontMetrics::averageCharWidth();
  this->mYAxisWidth = iVar1 << 2;
  QRect::setLeft(&this->mPlotRect,this->mYAxisWidth + 0x10);
  this_00 = (QWidget *)QAbstractScrollArea::viewport();
  iVar1 = QWidget::width(this_00);
  QRect::setRight(&this->mPlotRect,iVar1 + -8);
  calculateCellWidth(this);
  QFontMetrics::~QFontMetrics((QFontMetrics *)local_18);
  return;
}

Assistant:

void GraphEdit::calculateAxis() {

    // PADDING + mYAxisWidth + PADDING + mPlotRect.width() + PADDING = viewport()->width()
    auto metrics = fontMetrics();
    mYAxisWidth = metrics.averageCharWidth() * 4;
    mPlotRect.setLeft(mYAxisWidth + (TU::PADDING_X * 2));
    mPlotRect.setRight(viewport()->width() - TU::PADDING_X);
    calculateCellWidth();
}